

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-hexfloat.cc
# Opt level: O2

void __thiscall AllFloatsRoundtripTest::RunShard(AllFloatsRoundtripTest *this,int shard)

{
  size_t sVar1;
  int line;
  uint uVar2;
  LiteralType literal_type;
  char *message;
  uint uVar3;
  uint32_t local_c4;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  AssertionResult gtest_ar;
  AssertHelper local_a8;
  uint32_t new_bits;
  char buffer [100];
  
  uVar3 = 0xffffffff;
  local_c4 = 0;
  uVar2 = shard;
  while( true ) {
    if (uVar2 < local_c4) {
      if (shard == 0) {
        local_c4 = uVar2;
        puts("done.");
        fflush(_stdout);
      }
      return;
    }
    local_c4 = uVar2;
    if ((shard == 0) && (uVar2 >> 0x18 != uVar3)) {
      printf("value: 0x%08x (%d%%)\r",(ulong)uVar2,
             (ulong)(uint)(int)(((double)uVar2 * 100.0) / 4294967295.0));
      fflush(_stdout);
      uVar3 = uVar2 >> 0x18;
    }
    wabt::WriteFloatHex(buffer,100,local_c4);
    sVar1 = strlen(buffer);
    local_c0.ptr_._0_4_ = 0;
    literal_type = Nan - ((local_c4 & 0x7fffff) == 0);
    if ((~local_c4 & 0x7f800000) != 0) {
      literal_type = Hexfloat;
    }
    local_a8.data_._0_4_ = wabt::ParseFloat(literal_type,buffer,buffer + (int)sVar1,&new_bits);
    testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
              ((internal *)&gtest_ar,"Result::Ok",
               "ParseFloat(ClassifyFloat(bits), buffer, buffer + len, &new_bits)",(Enum *)&local_c0,
               (Result *)&local_a8);
    if (gtest_ar.success_ == false) break;
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&gtest_ar,"new_bits","bits",&new_bits,&local_c4);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_c0);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      line = 0xa9;
      goto LAB_0012603c;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    uVar2 = (this->super_ThreadedTest).num_threads_ + local_c4;
  }
  testing::Message::Message((Message *)&local_c0);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    message = "";
  }
  else {
    message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  line = 0xa8;
LAB_0012603c:
  testing::internal::AssertHelper::AssertHelper
            (&local_a8,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-hexfloat.cc"
             ,line,message);
  testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_c0);
  testing::internal::AssertHelper::~AssertHelper(&local_a8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_c0);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

virtual void RunShard(int shard) {
    char buffer[100];
    FOREACH_UINT32(bits) {
      LOG_COMPLETION(bits);
      WriteFloatHex(buffer, sizeof(buffer), bits);
      int len = strlen(buffer);

      uint32_t new_bits;
      ASSERT_EQ(Result::Ok, ParseFloat(ClassifyFloat(bits), buffer,
                                       buffer + len, &new_bits));
      ASSERT_EQ(new_bits, bits);
    }
    LOG_DONE();
  }